

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

errr finish_parse_object(parser *p)

{
  ushort uVar1;
  object_kind *poVar2;
  uint32_t uVar3;
  uint32_t local_24;
  wchar_t kidx;
  object_kind *next;
  object_kind *k;
  parser *p_local;
  
  z_info->k_max = 0;
  for (next = (object_kind *)parser_priv(p); next != (object_kind *)0x0; next = next->next) {
    z_info->k_max = z_info->k_max + 1;
  }
  k_info = (object_kind *)mem_zalloc((long)(int)(z_info->k_max + 1) * 0x2c0);
  uVar1 = z_info->k_max;
  next = (object_kind *)parser_priv(p);
  uVar3 = (uint)uVar1;
  while( true ) {
    local_24 = uVar3 - 1;
    if (next == (object_kind *)0x0) {
      z_info->k_max = z_info->k_max + 1;
      z_info->ordinary_kind_max = z_info->k_max;
      parser_destroy(p);
      return 0;
    }
    if ((int)local_24 < 0) break;
    memcpy(k_info + (int)local_24,next,0x2c0);
    k_info[(int)local_24].kidx = local_24;
    flag_union(k_info[(int)local_24].kind_flags,kb_info[next->tval].kind_flags,4);
    poVar2 = next->next;
    if ((int)local_24 < (int)(z_info->k_max - 1)) {
      k_info[(int)local_24].next = k_info + (int)uVar3;
    }
    else {
      k_info[(int)local_24].next = (object_kind *)0x0;
    }
    mem_free(next);
    next = poVar2;
    uVar3 = local_24;
  }
  __assert_fail("kidx >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                ,0x8b7,"errr finish_parse_object(struct parser *)");
}

Assistant:

static errr finish_parse_object(struct parser *p) {
	struct object_kind *k, *next = NULL;
	int kidx;

	/* scan the list for the max id */
	z_info->k_max = 0;
	k = parser_priv(p);
	while (k) {
		z_info->k_max++;
		k = k->next;
	}

	/* allocate the direct access list and copy the data to it */
	k_info = mem_zalloc((z_info->k_max + 1) * sizeof(*k));
	kidx = z_info->k_max - 1;
	for (k = parser_priv(p); k; k = next, kidx--) {
		assert(kidx >= 0);

		memcpy(&k_info[kidx], k, sizeof(*k));
		k_info[kidx].kidx = kidx;

		/* Add base kind flags to kind kind flags */
		kf_union(k_info[kidx].kind_flags, kb_info[k->tval].kind_flags);

		next = k->next;
		if (kidx < z_info->k_max - 1) {
			k_info[kidx].next = &k_info[kidx + 1];
		} else {
			k_info[kidx].next = NULL;
		}
		mem_free(k);
	}
	z_info->k_max += 1;
	z_info->ordinary_kind_max = z_info->k_max;

	parser_destroy(p);
	return 0;
}